

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  Arena *pAVar1;
  Rep *pRVar2;
  bool bVar3;
  CppType CVar4;
  RepeatedField<long> *pRVar5;
  RepeatedField<unsigned_int> *pRVar6;
  RepeatedField<unsigned_long> *pRVar7;
  RepeatedField<double> *pRVar8;
  RepeatedField<float> *pRVar9;
  RepeatedField<bool> *pRVar10;
  RepeatedField<int> *pRVar11;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar12;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar13;
  Extension *local_398;
  Extension *extension;
  FieldDescriptor *desc_local;
  bool packed_local;
  FieldType field_type_local;
  ExtensionSet *pEStack_380;
  int number_local;
  ExtensionSet *this_local;
  Arena *local_368;
  RepeatedField<int> *local_360;
  Arena *local_348;
  RepeatedField<int> *local_340;
  Arena *local_328;
  RepeatedField<long> *local_320;
  Arena *local_308;
  RepeatedField<unsigned_int> *local_300;
  Arena *local_2e8;
  RepeatedField<unsigned_long> *local_2e0;
  Arena *local_2c8;
  RepeatedField<float> *local_2c0;
  Arena *local_2a8;
  RepeatedField<double> *local_2a0;
  Arena *local_288;
  RepeatedField<bool> *local_280;
  Rep *local_268;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_260;
  Rep *local_248;
  RepeatedPtrField<google::protobuf::MessageLite> *local_240;
  Arena *local_238;
  Rep *local_230;
  Arena *local_228;
  Arena *local_220;
  Rep *local_218;
  Arena *local_210;
  RepeatedField<int> *local_208;
  RepeatedField<int> *t_7;
  byte local_1f1;
  Arena *local_1f0;
  RepeatedField<int> *local_1e8;
  RepeatedField<int> *t;
  byte local_1d1;
  Arena *local_1d0;
  Arena *local_1c8;
  Rep *local_1c0;
  Arena *local_1b8;
  RepeatedField<long> *local_1b0;
  RepeatedField<long> *t_1;
  byte local_199;
  Arena *local_198;
  Arena *local_190;
  Rep *local_188;
  Arena *local_180;
  RepeatedField<unsigned_int> *local_178;
  RepeatedField<unsigned_int> *t_2;
  byte local_161;
  Arena *local_160;
  Arena *local_158;
  Rep *local_150;
  Arena *local_148;
  RepeatedField<unsigned_long> *local_140;
  RepeatedField<unsigned_long> *t_3;
  byte local_129;
  Arena *local_128;
  Arena *local_120;
  Rep *local_118;
  Arena *local_110;
  RepeatedField<float> *local_108;
  RepeatedField<float> *t_5;
  byte local_f1;
  Arena *local_f0;
  Arena *local_e8;
  Rep *local_e0;
  Arena *local_d8;
  RepeatedField<double> *local_d0;
  RepeatedField<double> *t_4;
  byte local_b9;
  Arena *local_b8;
  Arena *local_b0;
  Rep *local_a8;
  Arena *local_a0;
  RepeatedField<bool> *local_98;
  RepeatedField<bool> *t_6;
  byte local_81;
  Arena *local_80;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *t_8;
  byte local_49;
  Rep *local_48;
  RepeatedPtrField<google::protobuf::MessageLite> local_40;
  RepeatedPtrField<google::protobuf::MessageLite> *local_28;
  RepeatedPtrField<google::protobuf::MessageLite> *t_9;
  byte local_11;
  Rep *local_10;
  
  extension = (Extension *)desc;
  desc_local._2_1_ = packed;
  desc_local._3_1_ = field_type;
  desc_local._4_4_ = number;
  pEStack_380 = this;
  bVar3 = MaybeNewExtension(this,number,desc,&local_398);
  if (bVar3) {
    local_398->is_repeated = true;
    local_398->type = desc_local._3_1_;
    local_398->is_packed = (bool)(desc_local._2_1_ & 1);
    CVar4 = WireFormatLite::FieldTypeToCppType((uint)desc_local._3_1_);
    switch(CVar4) {
    case CPPTYPE_INT32:
      pAVar1 = this->arena_;
      local_348 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar11 = (RepeatedField<int> *)operator_new(0x10);
        RepeatedField<int>::RepeatedField(pRVar11);
        local_340 = pRVar11;
      }
      else {
        local_230 = (Rep *)0x0;
        local_228 = pAVar1;
        local_1d1 = Arena::SkipDeleteList<google::protobuf::RepeatedField<int>>(0);
        t = (RepeatedField<int> *)&local_238;
        local_238 = pAVar1;
        local_1d0 = pAVar1;
        pRVar11 = (RepeatedField<int> *)
                  Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<int>::typeinfo,0x10);
        RepeatedField<int>::RepeatedField(pRVar11,*(Arena **)t);
        local_1e8 = pRVar11;
        if ((local_1d1 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar11,
                             arena_destruct_object<google::protobuf::RepeatedField<int>>);
        }
        local_340 = local_1e8;
      }
      (local_398->field_0).repeated_int32_value = local_340;
      break;
    case CPPTYPE_INT64:
      pAVar1 = this->arena_;
      local_328 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar5 = (RepeatedField<long> *)operator_new(0x10);
        RepeatedField<long>::RepeatedField(pRVar5);
        local_320 = pRVar5;
      }
      else {
        local_1c0 = (Rep *)0x0;
        local_1b8 = pAVar1;
        local_199 = Arena::SkipDeleteList<google::protobuf::RepeatedField<long>>(0);
        t_1 = (RepeatedField<long> *)&local_1c8;
        local_1c8 = pAVar1;
        local_198 = pAVar1;
        pRVar5 = (RepeatedField<long> *)
                 Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<long>::typeinfo,0x10);
        RepeatedField<long>::RepeatedField(pRVar5,*(Arena **)t_1);
        local_1b0 = pRVar5;
        if ((local_199 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar5,
                             arena_destruct_object<google::protobuf::RepeatedField<long>>);
        }
        local_320 = local_1b0;
      }
      (local_398->field_0).repeated_int64_value = local_320;
      break;
    case CPPTYPE_UINT32:
      pAVar1 = this->arena_;
      local_308 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar6 = (RepeatedField<unsigned_int> *)operator_new(0x10);
        RepeatedField<unsigned_int>::RepeatedField(pRVar6);
        local_300 = pRVar6;
      }
      else {
        local_188 = (Rep *)0x0;
        local_180 = pAVar1;
        local_161 = Arena::SkipDeleteList<google::protobuf::RepeatedField<unsigned_int>>(0);
        t_2 = (RepeatedField<unsigned_int> *)&local_190;
        local_190 = pAVar1;
        local_160 = pAVar1;
        pRVar6 = (RepeatedField<unsigned_int> *)
                 Arena::AllocateAligned
                           (pAVar1,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
        RepeatedField<unsigned_int>::RepeatedField(pRVar6,*(Arena **)t_2);
        local_178 = pRVar6;
        if ((local_161 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar6,
                             arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>);
        }
        local_300 = local_178;
      }
      (local_398->field_0).repeated_uint32_value = local_300;
      break;
    case CPPTYPE_UINT64:
      pAVar1 = this->arena_;
      local_2e8 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar7 = (RepeatedField<unsigned_long> *)operator_new(0x10);
        RepeatedField<unsigned_long>::RepeatedField(pRVar7);
        local_2e0 = pRVar7;
      }
      else {
        local_150 = (Rep *)0x0;
        local_148 = pAVar1;
        local_129 = Arena::SkipDeleteList<google::protobuf::RepeatedField<unsigned_long>>(0);
        t_3 = (RepeatedField<unsigned_long> *)&local_158;
        local_158 = pAVar1;
        local_128 = pAVar1;
        pRVar7 = (RepeatedField<unsigned_long> *)
                 Arena::AllocateAligned
                           (pAVar1,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
        RepeatedField<unsigned_long>::RepeatedField(pRVar7,*(Arena **)t_3);
        local_140 = pRVar7;
        if ((local_129 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar7,
                             arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>);
        }
        local_2e0 = local_140;
      }
      (local_398->field_0).repeated_uint64_value = local_2e0;
      break;
    case CPPTYPE_DOUBLE:
      pAVar1 = this->arena_;
      local_2a8 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar8 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<double>::RepeatedField(pRVar8);
        local_2a0 = pRVar8;
      }
      else {
        local_e0 = (Rep *)0x0;
        local_d8 = pAVar1;
        local_b9 = Arena::SkipDeleteList<google::protobuf::RepeatedField<double>>(0);
        t_4 = (RepeatedField<double> *)&local_e8;
        local_e8 = pAVar1;
        local_b8 = pAVar1;
        pRVar8 = (RepeatedField<double> *)
                 Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<double>::typeinfo,0x10);
        RepeatedField<double>::RepeatedField(pRVar8,*(Arena **)t_4);
        local_d0 = pRVar8;
        if ((local_b9 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar8,
                             arena_destruct_object<google::protobuf::RepeatedField<double>>);
        }
        local_2a0 = local_d0;
      }
      (local_398->field_0).repeated_double_value = local_2a0;
      break;
    case CPPTYPE_FLOAT:
      pAVar1 = this->arena_;
      local_2c8 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar9 = (RepeatedField<float> *)operator_new(0x10);
        RepeatedField<float>::RepeatedField(pRVar9);
        local_2c0 = pRVar9;
      }
      else {
        local_118 = (Rep *)0x0;
        local_110 = pAVar1;
        local_f1 = Arena::SkipDeleteList<google::protobuf::RepeatedField<float>>(0);
        t_5 = (RepeatedField<float> *)&local_120;
        local_120 = pAVar1;
        local_f0 = pAVar1;
        pRVar9 = (RepeatedField<float> *)
                 Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<float>::typeinfo,0x10);
        RepeatedField<float>::RepeatedField(pRVar9,*(Arena **)t_5);
        local_108 = pRVar9;
        if ((local_f1 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar9,
                             arena_destruct_object<google::protobuf::RepeatedField<float>>);
        }
        local_2c0 = local_108;
      }
      (local_398->field_0).repeated_float_value = local_2c0;
      break;
    case CPPTYPE_BOOL:
      pAVar1 = this->arena_;
      local_288 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar10 = (RepeatedField<bool> *)operator_new(0x10);
        RepeatedField<bool>::RepeatedField(pRVar10);
        local_280 = pRVar10;
      }
      else {
        local_a8 = (Rep *)0x0;
        local_a0 = pAVar1;
        local_81 = Arena::SkipDeleteList<google::protobuf::RepeatedField<bool>>(0);
        t_6 = (RepeatedField<bool> *)&local_b0;
        local_b0 = pAVar1;
        local_80 = pAVar1;
        pRVar10 = (RepeatedField<bool> *)
                  Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
        RepeatedField<bool>::RepeatedField(pRVar10,*(Arena **)t_6);
        local_98 = pRVar10;
        if ((local_81 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar10,
                             arena_destruct_object<google::protobuf::RepeatedField<bool>>);
        }
        local_280 = local_98;
      }
      (local_398->field_0).repeated_bool_value = local_280;
      break;
    case CPPTYPE_ENUM:
      pAVar1 = this->arena_;
      local_368 = pAVar1;
      if (pAVar1 == (Arena *)0x0) {
        pRVar11 = (RepeatedField<int> *)operator_new(0x10);
        RepeatedField<int>::RepeatedField(pRVar11);
        local_360 = pRVar11;
      }
      else {
        local_218 = (Rep *)0x0;
        local_210 = pAVar1;
        local_1f1 = Arena::SkipDeleteList<google::protobuf::RepeatedField<int>>(0);
        t_7 = (RepeatedField<int> *)&local_220;
        local_220 = pAVar1;
        local_1f0 = pAVar1;
        pRVar11 = (RepeatedField<int> *)
                  Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<int>::typeinfo,0x10);
        RepeatedField<int>::RepeatedField(pRVar11,*(Arena **)t_7);
        local_208 = pRVar11;
        if ((local_1f1 & 1) == 0) {
          Arena::AddListNode(pAVar1,pRVar11,
                             arena_destruct_object<google::protobuf::RepeatedField<int>>);
        }
        local_360 = local_208;
      }
      (local_398->field_0).repeated_int32_value = local_360;
      break;
    case CPPTYPE_STRING:
      pRVar2 = (Rep *)this->arena_;
      local_268 = pRVar2;
      if (pRVar2 == (Rep *)0x0) {
        pRVar12 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x18);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::RepeatedPtrField(pRVar12);
        local_260 = pRVar12;
      }
      else {
        local_78.super_RepeatedPtrFieldBase.current_size_ = 0;
        local_78.super_RepeatedPtrFieldBase.total_size_ = 0;
        local_78.super_RepeatedPtrFieldBase.rep_ = pRVar2;
        local_49 = Arena::SkipDeleteList<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                             (0);
        t_8 = &local_78;
        local_78.super_RepeatedPtrFieldBase.arena_ = (Arena *)pRVar2;
        local_48 = pRVar2;
        pRVar12 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)Arena::AllocateAligned
                               ((Arena *)pRVar2,
                                (type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18)
        ;
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::RepeatedPtrField(pRVar12,(t_8->super_RepeatedPtrFieldBase).arena_);
        local_60 = pRVar12;
        if ((local_49 & 1) == 0) {
          Arena::AddListNode((Arena *)pRVar2,pRVar12,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            );
        }
        local_260 = local_60;
      }
      (local_398->field_0).repeated_string_value = local_260;
      break;
    case CPPTYPE_MESSAGE:
      pRVar2 = (Rep *)this->arena_;
      local_248 = pRVar2;
      if (pRVar2 == (Rep *)0x0) {
        pRVar13 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
        RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField(pRVar13);
        local_240 = pRVar13;
      }
      else {
        local_40.super_RepeatedPtrFieldBase.current_size_ = 0;
        local_40.super_RepeatedPtrFieldBase.total_size_ = 0;
        local_40.super_RepeatedPtrFieldBase.rep_ = pRVar2;
        local_11 = Arena::
                   SkipDeleteList<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                             (0);
        t_9 = &local_40;
        local_40.super_RepeatedPtrFieldBase.arena_ = (Arena *)pRVar2;
        local_10 = pRVar2;
        pRVar13 = (RepeatedPtrField<google::protobuf::MessageLite> *)
                  Arena::AllocateAligned
                            ((Arena *)pRVar2,
                             (type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo
                             ,0x18);
        RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                  (pRVar13,(t_9->super_RepeatedPtrFieldBase).arena_);
        local_28 = pRVar13;
        if ((local_11 & 1) == 0) {
          Arena::AddListNode((Arena *)pRVar2,pRVar13,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                            );
        }
        local_240 = local_28;
      }
      (local_398->field_0).repeated_message_value = local_240;
    }
  }
  return (void *)(local_398->field_0).int64_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->repeated_int32_value =
            Arena::CreateMessage<RepeatedField<int32> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->repeated_int64_value =
            Arena::CreateMessage<RepeatedField<int64> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->repeated_uint32_value =
            Arena::CreateMessage<RepeatedField<uint32> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->repeated_uint64_value =
            Arena::CreateMessage<RepeatedField<uint64> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->repeated_double_value =
            Arena::CreateMessage<RepeatedField<double> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->repeated_float_value =
            Arena::CreateMessage<RepeatedField<float> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->repeated_bool_value =
            Arena::CreateMessage<RepeatedField<bool> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->repeated_enum_value =
            Arena::CreateMessage<RepeatedField<int> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->repeated_string_value =
            Arena::CreateMessage<RepeatedPtrField< ::std::string> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->repeated_message_value =
            Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}